

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O3

int64_t parse_uint(uint8_t *s,size_t len)

{
  long lVar1;
  size_t sVar2;
  ulong uVar3;
  
  if (len != 0) {
    sVar2 = 0;
    lVar1 = 0;
    while ((0xf5 < (byte)(s[sVar2] - 0x3a) && (lVar1 < 0xccccccccccccccd))) {
      uVar3 = (ulong)(s[sVar2] & 0xf);
      if ((long)(uVar3 ^ 0x7fffffffffffffff) < lVar1 * 10) {
        return -1;
      }
      lVar1 = lVar1 * 10 + uVar3;
      sVar2 = sVar2 + 1;
      if (len == sVar2) {
        return lVar1;
      }
    }
  }
  return -1;
}

Assistant:

static int64_t parse_uint(const uint8_t *s, size_t len) {
  int64_t n = 0;
  size_t i;
  if (len == 0) {
    return -1;
  }
  for (i = 0; i < len; ++i) {
    if ('0' <= s[i] && s[i] <= '9') {
      if (n > INT64_MAX / 10) {
        return -1;
      }
      n *= 10;
      if (n > INT64_MAX - (s[i] - '0')) {
        return -1;
      }
      n += s[i] - '0';
      continue;
    }
    return -1;
  }
  return n;
}